

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_write.c
# Opt level: O1

int main(int argc,char **args)

{
  char *file_name;
  int iVar1;
  light_pcapng pcapng;
  FILE *__stream;
  uint32_t *__s1;
  FILE *__stream_00;
  void *__ptr;
  size_t sVar2;
  ulong uVar3;
  size_t size;
  stat f_info;
  size_t local_e8;
  FILE *local_e0;
  FILE *local_d8;
  ulong local_d0;
  char **local_c8;
  stat local_c0;
  
  if (1 < argc) {
    local_d0 = (ulong)(uint)argc;
    uVar3 = 1;
    local_c8 = args;
    do {
      file_name = local_c8[uVar3];
      pcapng = light_read_from_path(file_name);
      if (pcapng == (light_pcapng)0x0) {
        fprintf(_stderr,"Unable to read pcapng: %s\n",file_name);
      }
      else {
        __stream = fopen("/tmp/pcapng.tmp","wb");
        __s1 = light_pcapng_to_memory(pcapng,&local_e8);
        __stream_00 = fopen(file_name,"rb");
        stat(file_name,&local_c0);
        if (local_e8 == local_c0.st_size) {
          local_e0 = __stream;
          printf("Data for %s: %zu bytes\n",file_name);
          sVar2 = local_e8;
          __ptr = calloc(local_e8,1);
          local_d8 = __stream_00;
          sVar2 = fread(__ptr,1,sVar2,__stream_00);
          if (sVar2 == local_e8) {
            iVar1 = bcmp(__s1,__ptr,local_e8);
            if (iVar1 == 0) {
              printf("SUCCESS for %s\n\n",file_name);
            }
            else {
              fprintf(_stderr,"FAILURE for %s\n\n",file_name);
            }
            __stream = local_e0;
            fwrite(__s1,local_e8,1,local_e0);
            free(__ptr);
            __stream_00 = local_d8;
          }
          else {
            fprintf(_stderr,"Error reading %s!\n",file_name);
            free(__ptr);
            __stream_00 = local_d8;
            __stream = local_e0;
          }
        }
        else {
          fprintf(_stderr,"Memory size mismatch %zu != %zu\n");
        }
        fclose(__stream_00);
        fclose(__stream);
        free(__s1);
        light_pcapng_release(pcapng);
      }
      uVar3 = uVar3 + 1;
    } while (local_d0 != uVar3);
  }
  return 0;
}

Assistant:

int main(int argc, const char **args) {
	int i;

	for (i = 1; i < argc; ++i) {
		const char *file = args[i];
		light_pcapng pcapng = light_read_from_path(file);
		if (pcapng != NULL) {
			FILE *tmp = fopen(TMP_FILE, "wb");
			size_t size;
			uint32_t *data = light_pcapng_to_memory(pcapng, &size);
			struct stat f_info;
			FILE *f_check = fopen(file, "rb");
			uint8_t *data_check;
			int status = 0;

			stat(file, &f_info);
			if (size != f_info.st_size) {
				fprintf(stderr, "Memory size mismatch %zu != %zu\n", size, f_info.st_size);
				goto EARLY_FAILURE;
			}
			printf("Data for %s: %zu bytes\n", file, size);

			data_check = calloc(size, 1);
			if (fread(data_check, 1, size, f_check) != size) {
				fprintf(stderr, "Error reading %s!\n", file);
				free(data_check);
				goto EARLY_FAILURE;
			}

			status = memcmp(data, data_check, size);

			if (status == 0) {
				printf("SUCCESS for %s\n\n", file);
			}
			else {
				fprintf(stderr, "FAILURE for %s\n\n", file);
			}

			fwrite(data, size, 1, tmp);

			free(data_check);
EARLY_FAILURE:
			fclose(f_check);
			fclose(tmp);
			free(data);
			light_pcapng_release(pcapng);
		}
		else {
			fprintf(stderr, "Unable to read pcapng: %s\n", file);
		}
	}

	// unlink(TMP_FILE);

	return EXIT_SUCCESS;
}